

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O1

int uv_cpu_info(uv_cpu_info_t **cpu_infos,int *count)

{
  bool bVar1;
  undefined1 auVar2 [16];
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  uv_cpu_info_t *cpu_infos_00;
  FILE *pFVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  int *piVar9;
  uv_cpu_info_t *puVar10;
  uint unaff_EBP;
  ulong __nmemb;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  uint64_t user;
  uint local_474;
  uint *local_470;
  uv_cpu_info_t **local_468;
  uint64_t irq;
  uint64_t idle;
  uint64_t sys;
  uint64_t nice;
  uint64_t dummy;
  char buf [1024];
  
  *cpu_infos = (uv_cpu_info_t *)0x0;
  *count = 0;
  __stream = (FILE *)uv__open_file("/proc/stat");
  if (__stream == (FILE *)0x0) {
    piVar9 = __errno_location();
    return -*piVar9;
  }
  pcVar4 = fgets(buf,0x400,__stream);
  if (pcVar4 == (char *)0x0) {
    iVar15 = -5;
  }
  else {
    pcVar4 = fgets(buf,0x400,__stream);
    unaff_EBP = 0;
    if (pcVar4 != (char *)0x0) {
      do {
        if (buf[2] != 'u' || buf._0_2_ != 0x7063) break;
        unaff_EBP = unaff_EBP + 1;
        pcVar4 = fgets(buf,0x400,__stream);
      } while (pcVar4 != (char *)0x0);
    }
    iVar15 = (uint)(unaff_EBP != 0) * 5 + -5;
  }
  if (-1 < iVar15) {
    __nmemb = (ulong)unaff_EBP;
    local_468 = cpu_infos;
    cpu_infos_00 = (uv_cpu_info_t *)uv__calloc(__nmemb,0x38);
    if (cpu_infos_00 != (uv_cpu_info_t *)0x0) {
      pFVar5 = (FILE *)uv__open_file("/proc/cpuinfo");
      local_470 = (uint *)count;
      if (pFVar5 == (FILE *)0x0) {
        piVar9 = __errno_location();
        iVar15 = -*piVar9;
      }
      else {
        pcVar4 = fgets(buf,0x400,pFVar5);
        if (pcVar4 != (char *)0x0) {
          uVar8 = 0;
          uVar14 = 0;
LAB_00674255:
          uVar8 = uVar8 & 0xffffffff;
          do {
            if ((uVar8 < __nmemb) &&
               (CONCAT26(buf._11_2_,CONCAT33(buf._8_3_,buf._5_3_)) == 0x203a09656d616e20 &&
                CONCAT44(buf._4_4_,CONCAT13(buf[3],CONCAT12(buf[2],buf._0_2_))) ==
                0x616e206c65646f6d)) {
              sVar6 = strlen(buf + 0xd);
              pcVar4 = uv__strndup(buf + 0xd,sVar6 - 1);
              if (pcVar4 == (char *)0x0) {
                fclose(pFVar5);
                goto LAB_006743c0;
              }
              uVar12 = uVar8 + 1;
              cpu_infos_00[uVar8].model = pcVar4;
            }
            else {
              uVar12 = uVar8;
              if ((uVar14 < __nmemb) &&
                 (CONCAT35(buf._8_3_,CONCAT41(buf._4_4_,buf[3])) == 0x203a09097a484d20 &&
                  CONCAT44(buf._4_4_,CONCAT13(buf[3],CONCAT12(buf[2],buf._0_2_))) ==
                  0x97a484d20757063)) goto LAB_006742ff;
            }
            pcVar4 = fgets(buf,0x400,pFVar5);
            uVar8 = uVar12;
            if (pcVar4 == (char *)0x0) goto LAB_00674351;
          } while( true );
        }
        uVar12 = 0;
LAB_00674351:
        fclose(pFVar5);
        uVar11 = (uint)uVar12;
        if (uVar11 == 0) {
          pcVar4 = "unknown";
        }
        else {
          pcVar4 = cpu_infos_00[uVar11 - 1].model;
        }
        iVar15 = 0;
        if (uVar11 < unaff_EBP) {
          puVar10 = cpu_infos_00 + (uVar12 & 0xffffffff);
          lVar13 = __nmemb - (uVar12 & 0xffffffff);
          do {
            sVar6 = strlen(pcVar4);
            pcVar7 = uv__strndup(pcVar4,sVar6);
            if (pcVar7 == (char *)0x0) goto LAB_006743c0;
            puVar10->model = pcVar7;
            puVar10 = puVar10 + 1;
            lVar13 = lVar13 + -1;
          } while (lVar13 != 0);
        }
      }
      goto LAB_006743cb;
    }
    iVar15 = -0xc;
  }
LAB_0067464d:
  iVar3 = fclose(__stream);
  if (iVar3 != 0) {
    piVar9 = __errno_location();
    if ((*piVar9 != 4) && (*piVar9 != 0x73)) {
LAB_0067467f:
      abort();
    }
  }
  return iVar15;
LAB_006742ff:
  iVar15 = atoi(buf + 0xb);
  cpu_infos_00[uVar14].speed = iVar15;
  pcVar4 = fgets(buf,0x400,pFVar5);
  uVar14 = uVar14 + 1;
  if (pcVar4 == (char *)0x0) goto LAB_00674351;
  goto LAB_00674255;
LAB_006743c0:
  iVar15 = -0xc;
LAB_006743cb:
  if (iVar15 == 0) {
    uVar8 = sysconf(2);
    if ((int)uVar8 == 0) {
      __assert_fail("ticks != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                    ,0x21c,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
    }
    if ((int)uVar8 == -1) {
      __assert_fail("ticks != (unsigned int) -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                    ,0x21b,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar8 & 0xffffffff;
    lVar13 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(1000)) / auVar2,0);
    rewind(__stream);
    pcVar4 = fgets(buf,0x400,__stream);
    if (pcVar4 == (char *)0x0) goto LAB_0067467f;
    pcVar4 = fgets(buf,0x400,__stream);
    uVar8 = 0;
    if ((unaff_EBP != 0) && (pcVar4 != (char *)0x0)) {
      uVar14 = 0;
      while (uVar8 = uVar14, buf[2] == 'u' && buf._0_2_ == 0x7063) {
        iVar15 = __isoc99_sscanf(buf,"cpu%u ",&local_474);
        if (iVar15 != 1) {
          __assert_fail("r == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                        ,0x231,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
        }
        pcVar4 = buf + 4;
        uVar11 = local_474;
        do {
          pcVar4 = pcVar4 + 1;
          bVar1 = 9 < uVar11;
          uVar11 = uVar11 / 10;
        } while (bVar1);
        iVar15 = __isoc99_sscanf(pcVar4,"%lu %lu %lu%lu %lu %lu",&user,&nice,&sys,&idle,&dummy,&irq)
        ;
        if (iVar15 != 6) goto LAB_0067467f;
        uVar8 = uVar14 + 1;
        cpu_infos_00[uVar14].cpu_times.user = user * lVar13;
        cpu_infos_00[uVar14].cpu_times.nice = nice * lVar13;
        cpu_infos_00[uVar14].cpu_times.sys = sys * lVar13;
        cpu_infos_00[uVar14].cpu_times.idle = idle * lVar13;
        cpu_infos_00[uVar14].cpu_times.irq = irq * lVar13;
        pcVar4 = fgets(buf,0x400,__stream);
        if ((pcVar4 == (char *)0x0) || (uVar14 = uVar8, __nmemb <= uVar8)) break;
      }
    }
    if (uVar8 != __nmemb) {
      __assert_fail("num == numcpus",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                    ,0x24e,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
    }
    iVar15 = 0;
  }
  if (iVar15 == 0) {
    if (unaff_EBP != 0 && cpu_infos_00->speed == 0) {
      piVar9 = &cpu_infos_00->speed;
      uVar8 = 0;
      do {
        snprintf(buf,0x400,"/sys/devices/system/cpu/cpu%u/cpufreq/scaling_cur_freq",
                 uVar8 & 0xffffffff);
        pFVar5 = (FILE *)uv__open_file(buf);
        iVar15 = 0;
        if (pFVar5 != (FILE *)0x0) {
          iVar15 = __isoc99_fscanf(pFVar5,"%lu",&user);
          if (iVar15 != 1) {
            user = 0;
          }
          fclose(pFVar5);
          iVar15 = (int)(user / 1000);
        }
        *piVar9 = iVar15;
        uVar8 = uVar8 + 1;
        piVar9 = piVar9 + 0xe;
      } while (__nmemb != uVar8);
    }
    *local_468 = cpu_infos_00;
    *local_470 = unaff_EBP;
    iVar15 = 0;
  }
  else {
    uv_free_cpu_info(cpu_infos_00,unaff_EBP);
  }
  goto LAB_0067464d;
}

Assistant:

int uv_cpu_info(uv_cpu_info_t** cpu_infos, int* count) {
  unsigned int numcpus;
  uv_cpu_info_t* ci;
  int err;
  FILE* statfile_fp;

  *cpu_infos = NULL;
  *count = 0;

  statfile_fp = uv__open_file("/proc/stat");
  if (statfile_fp == NULL)
    return UV__ERR(errno);

  err = uv__cpu_num(statfile_fp, &numcpus);
  if (err < 0)
    goto out;

  err = UV_ENOMEM;
  ci = uv__calloc(numcpus, sizeof(*ci));
  if (ci == NULL)
    goto out;

  err = read_models(numcpus, ci);
  if (err == 0)
    err = read_times(statfile_fp, numcpus, ci);

  if (err) {
    uv_free_cpu_info(ci, numcpus);
    goto out;
  }

  /* read_models() on x86 also reads the CPU speed from /proc/cpuinfo.
   * We don't check for errors here. Worst case, the field is left zero.
   */
  if (ci[0].speed == 0)
    read_speeds(numcpus, ci);

  *cpu_infos = ci;
  *count = numcpus;
  err = 0;

out:

  if (fclose(statfile_fp))
    if (errno != EINTR && errno != EINPROGRESS)
      abort();

  return err;
}